

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O1

void __thiscall TCLAP::CmdLine::missingArgsException(CmdLine *this)

{
  _List_node_base *p_Var1;
  bool bVar2;
  char cVar3;
  CmdLineParseException *this_00;
  char *pcVar4;
  int iVar5;
  _List_node_base *p_Var6;
  string msg;
  string missingArgList;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  p_Var6 = (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  iVar5 = 0;
  bVar2 = false;
  if (p_Var6 != (_List_node_base *)&this->_argList) {
    do {
      cVar3 = (**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x28))();
      if ((cVar3 != '\0') &&
         ((p_Var1 = p_Var6[1]._M_next, *(char *)((long)(p_Var1 + 9) + 1) != '\x01' ||
          (*(char *)((long)(p_Var1 + 10) + 1) == '\x01')))) {
        std::__cxx11::string::_M_append
                  ((char *)&local_70,(ulong)*(_List_node_base **)((long)(p_Var1 + 2) + 8));
        std::__cxx11::string::append((char *)&local_70);
        iVar5 = iVar5 + 1;
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)&this->_argList);
    bVar2 = 1 < iVar5;
  }
  std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pcVar4 = "Required argument missing: ";
  if (bVar2) {
    pcVar4 = "Required arguments missing: ";
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar4);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
  this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"undefined","");
  CmdLineParseException::CmdLineParseException(this_00,&local_90,&local_50);
  __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline void CmdLine::missingArgsException()
{
		int count = 0;

		std::string missingArgList;
		for (ArgListIterator it = _argList.begin(); it != _argList.end(); it++)
		{
			if ( (*it)->isRequired() && !(*it)->isSet() )
			{
				missingArgList += (*it)->getName();
				missingArgList += ", ";
				count++;
			}
		}
		missingArgList = missingArgList.substr(0,missingArgList.length()-2);

		std::string msg;
		if ( count > 1 )
			msg = "Required arguments missing: ";
		else
			msg = "Required argument missing: ";

		msg += missingArgList;

		throw(CmdLineParseException(msg));
}